

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::GetListOfMacros(cmMakefile *this,string *macros)

{
  ulong uVar1;
  string local_38;
  string *local_18;
  string *macros_local;
  cmMakefile *this_local;
  
  local_18 = macros;
  macros_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __assert_fail("macros.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmMakefile.cxx"
                  ,0xe9e,"void cmMakefile::GetListOfMacros(std::string &) const");
  }
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_38,&this->MacrosList,";");
  std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmMakefile::GetListOfMacros(std::string& macros) const
{
  assert(macros.empty());
  macros = cmJoin(this->MacrosList, ";");
}